

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O1

void __thiscall
mp::
CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>_>
::CustomFunctionalConstraint
          (CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>_>
           *this,Arguments *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Arguments local_200;
  
  (this->super_FunctionalConstraint).super_BasicConstraint.name_._M_dataplus._M_p =
       (pointer)&(this->super_FunctionalConstraint).super_BasicConstraint.name_.field_2;
  (this->super_FunctionalConstraint).super_BasicConstraint.name_._M_string_length = 0;
  (this->super_FunctionalConstraint).super_BasicConstraint.name_.field_2._M_local_buf[0] = '\0';
  (this->super_FunctionalConstraint).result_var_ = -1;
  (this->super_FunctionalConstraint).ctx = CTX_NONE;
  paVar2 = &local_200.super_BasicConstraint.name_.field_2;
  local_200.super_BasicConstraint.name_._M_dataplus._M_p =
       (args->super_BasicConstraint).name_._M_dataplus._M_p;
  paVar1 = &(args->super_BasicConstraint).name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200.super_BasicConstraint.name_._M_dataplus._M_p == paVar1) {
    local_200.super_BasicConstraint.name_.field_2._M_allocated_capacity =
         paVar1->_M_allocated_capacity;
    local_200.super_BasicConstraint.name_.field_2._8_8_ =
         *(undefined8 *)((long)&(args->super_BasicConstraint).name_.field_2 + 8);
    local_200.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_200.super_BasicConstraint.name_.field_2._M_allocated_capacity =
         paVar1->_M_allocated_capacity;
  }
  local_200.super_BasicConstraint.name_._M_string_length =
       (args->super_BasicConstraint).name_._M_string_length;
  (args->super_BasicConstraint).name_._M_dataplus._M_p = (pointer)paVar1;
  (args->super_BasicConstraint).name_._M_string_length = 0;
  (args->super_BasicConstraint).name_.field_2._M_local_buf[0] = '\0';
  local_200.super_QuadAndLinTerms.super_LinTerms.coefs_.
  super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_capacity =
       (args->super_QuadAndLinTerms).super_LinTerms.coefs_.
       super_small_vector_base<std::allocator<double>,_6U>.m_data.
       super_small_vector_data_base<double_*,_unsigned_long>.m_capacity;
  if (local_200.super_QuadAndLinTerms.super_LinTerms.coefs_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity < 7) {
    local_200.super_QuadAndLinTerms.super_LinTerms.coefs_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         (ptr)((long)&local_200.super_QuadAndLinTerms.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data + 0x18);
    local_200.super_QuadAndLinTerms.super_LinTerms.coefs_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
    local_200.super_QuadAndLinTerms.super_LinTerms.coefs_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_size =
         (args->super_QuadAndLinTerms).super_LinTerms.coefs_.
         super_small_vector_base<std::allocator<double>,_6U>.m_data.
         super_small_vector_data_base<double_*,_unsigned_long>.m_size;
    if (local_200.super_QuadAndLinTerms.super_LinTerms.coefs_.
        super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_size != 0) {
      memcpy(local_200.super_QuadAndLinTerms.super_LinTerms.coefs_.
             super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
             (args->super_QuadAndLinTerms).super_LinTerms.coefs_.
             super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
             local_200.super_QuadAndLinTerms.super_LinTerms.coefs_.
             super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_size * 8);
    }
  }
  else {
    local_200.super_QuadAndLinTerms.super_LinTerms.coefs_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         (args->super_QuadAndLinTerms).super_LinTerms.coefs_.
         super_small_vector_base<std::allocator<double>,_6U>.m_data.
         super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
    local_200.super_QuadAndLinTerms.super_LinTerms.coefs_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_size =
         (args->super_QuadAndLinTerms).super_LinTerms.coefs_.
         super_small_vector_base<std::allocator<double>,_6U>.m_data.
         super_small_vector_data_base<double_*,_unsigned_long>.m_size;
    (args->super_QuadAndLinTerms).super_LinTerms.coefs_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
    (args->super_QuadAndLinTerms).super_LinTerms.coefs_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         (ptr)&(args->super_QuadAndLinTerms).super_LinTerms.coefs_.
               super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage;
    (args->super_QuadAndLinTerms).super_LinTerms.coefs_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
  }
  local_200.super_QuadAndLinTerms.super_LinTerms.vars_.
  super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_capacity =
       (args->super_QuadAndLinTerms).super_LinTerms.vars_.
       super_small_vector_base<std::allocator<int>,_6U>.m_data.
       super_small_vector_data_base<int_*,_unsigned_long>.m_capacity;
  if (local_200.super_QuadAndLinTerms.super_LinTerms.vars_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity < 7) {
    local_200.super_QuadAndLinTerms.super_LinTerms.vars_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)((long)&local_200.super_QuadAndLinTerms.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data + 0x18);
    local_200.super_QuadAndLinTerms.super_LinTerms.vars_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    local_200.super_QuadAndLinTerms.super_LinTerms.vars_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size =
         (args->super_QuadAndLinTerms).super_LinTerms.vars_.
         super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_size;
    if (local_200.super_QuadAndLinTerms.super_LinTerms.vars_.
        super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_size != 0) {
      memcpy(local_200.super_QuadAndLinTerms.super_LinTerms.vars_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
             (args->super_QuadAndLinTerms).super_LinTerms.vars_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
             local_200.super_QuadAndLinTerms.super_LinTerms.vars_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_size * 4);
    }
  }
  else {
    local_200.super_QuadAndLinTerms.super_LinTerms.vars_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (args->super_QuadAndLinTerms).super_LinTerms.vars_.
         super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
    local_200.super_QuadAndLinTerms.super_LinTerms.vars_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size =
         (args->super_QuadAndLinTerms).super_LinTerms.vars_.
         super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_size;
    (args->super_QuadAndLinTerms).super_LinTerms.vars_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    (args->super_QuadAndLinTerms).super_LinTerms.vars_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)&(args->super_QuadAndLinTerms).super_LinTerms.vars_.
               super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
    (args->super_QuadAndLinTerms).super_LinTerms.vars_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
  }
  gch::detail::small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>::
  move_initialize<8U,_nullptr>
            ((small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *)
             &local_200.super_QuadAndLinTerms.super_QuadTerms,
             (small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *)
             &(args->super_QuadAndLinTerms).super_QuadTerms);
  local_200.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
  super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_capacity =
       (args->super_QuadAndLinTerms).super_QuadTerms.coefs_aux_.
       super_small_vector_base<std::allocator<double>,_6U>.m_data.
       super_small_vector_data_base<double_*,_unsigned_long>.m_capacity;
  if (local_200.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity < 7) {
    local_200.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         (ptr)((long)&local_200.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data + 0x18);
    local_200.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
    local_200.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_size =
         (args->super_QuadAndLinTerms).super_QuadTerms.coefs_aux_.
         super_small_vector_base<std::allocator<double>,_6U>.m_data.
         super_small_vector_data_base<double_*,_unsigned_long>.m_size;
    if (local_200.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
        super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_size != 0) {
      memcpy(local_200.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
             super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
             (args->super_QuadAndLinTerms).super_QuadTerms.coefs_aux_.
             super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
             local_200.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
             super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_size * 8);
    }
  }
  else {
    local_200.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         (args->super_QuadAndLinTerms).super_QuadTerms.coefs_aux_.
         super_small_vector_base<std::allocator<double>,_6U>.m_data.
         super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
    local_200.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_size =
         (args->super_QuadAndLinTerms).super_QuadTerms.coefs_aux_.
         super_small_vector_base<std::allocator<double>,_6U>.m_data.
         super_small_vector_data_base<double_*,_unsigned_long>.m_size;
    (args->super_QuadAndLinTerms).super_QuadTerms.coefs_aux_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
    (args->super_QuadAndLinTerms).super_QuadTerms.coefs_aux_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         (ptr)&(args->super_QuadAndLinTerms).super_QuadTerms.coefs_aux_.
               super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage;
    (args->super_QuadAndLinTerms).super_QuadTerms.coefs_aux_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
  }
  local_200.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
  super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_capacity =
       (args->super_QuadAndLinTerms).super_QuadTerms.vars1_aux_.
       super_small_vector_base<std::allocator<int>,_6U>.m_data.
       super_small_vector_data_base<int_*,_unsigned_long>.m_capacity;
  if (local_200.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity < 7) {
    local_200.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)((long)&local_200.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data + 0x18);
    local_200.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    local_200.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size =
         (args->super_QuadAndLinTerms).super_QuadTerms.vars1_aux_.
         super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_size;
    if (local_200.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
        super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_size != 0) {
      memcpy(local_200.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
             (args->super_QuadAndLinTerms).super_QuadTerms.vars1_aux_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
             local_200.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_size * 4);
    }
  }
  else {
    local_200.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (args->super_QuadAndLinTerms).super_QuadTerms.vars1_aux_.
         super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
    local_200.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size =
         (args->super_QuadAndLinTerms).super_QuadTerms.vars1_aux_.
         super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_size;
    (args->super_QuadAndLinTerms).super_QuadTerms.vars1_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    (args->super_QuadAndLinTerms).super_QuadTerms.vars1_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)&(args->super_QuadAndLinTerms).super_QuadTerms.vars1_aux_.
               super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
    (args->super_QuadAndLinTerms).super_QuadTerms.vars1_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
  }
  local_200.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
  super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_capacity =
       (args->super_QuadAndLinTerms).super_QuadTerms.vars2_aux_.
       super_small_vector_base<std::allocator<int>,_6U>.m_data.
       super_small_vector_data_base<int_*,_unsigned_long>.m_capacity;
  if (local_200.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity < 7) {
    local_200.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)((long)&local_200.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data + 0x18);
    local_200.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    local_200.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size =
         (args->super_QuadAndLinTerms).super_QuadTerms.vars2_aux_.
         super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_size;
    if (local_200.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
        super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_size != 0) {
      memcpy(local_200.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
             (args->super_QuadAndLinTerms).super_QuadTerms.vars2_aux_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
             local_200.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_size * 4);
    }
  }
  else {
    local_200.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (args->super_QuadAndLinTerms).super_QuadTerms.vars2_aux_.
         super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
    local_200.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size =
         (args->super_QuadAndLinTerms).super_QuadTerms.vars2_aux_.
         super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_size;
    (args->super_QuadAndLinTerms).super_QuadTerms.vars2_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    (args->super_QuadAndLinTerms).super_QuadTerms.vars2_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)&(args->super_QuadAndLinTerms).super_QuadTerms.vars2_aux_.
               super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
    (args->super_QuadAndLinTerms).super_QuadTerms.vars2_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
  }
  local_200.super_AlgConRhs<1>.rhs_ = (args->super_AlgConRhs<1>).rhs_;
  CustomConstraintData<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>_>
  ::CustomConstraintData
            (&this->
              super_CustomConstraintData<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>_>
             ,&local_200);
  if (6 < local_200.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_200.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_200.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_200.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_200.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_200.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_200.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
          super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_200.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_200.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if (8 < local_200.super_QuadAndLinTerms.super_QuadTerms.folded_.
          super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
          m_data.
          super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
          m_capacity) {
    operator_delete(local_200.super_QuadAndLinTerms.super_QuadTerms.folded_.
                    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                    .m_data.
                    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                    .m_data_ptr,
                    local_200.super_QuadAndLinTerms.super_QuadTerms.folded_.
                    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                    .m_data.
                    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                    .m_capacity << 4);
  }
  if (6 < local_200.super_QuadAndLinTerms.super_LinTerms.vars_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_200.super_QuadAndLinTerms.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_200.super_QuadAndLinTerms.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_200.super_QuadAndLinTerms.super_LinTerms.coefs_.
          super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_200.super_QuadAndLinTerms.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_200.super_QuadAndLinTerms.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200.super_BasicConstraint.name_._M_dataplus._M_p != paVar2) {
    operator_delete(local_200.super_BasicConstraint.name_._M_dataplus._M_p,
                    local_200.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

CustomFunctionalConstraint(Arguments args) noexcept :
    BaseType(std::move(args)) { }